

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O0

cmValue __thiscall cmSourceFile::GetProperty(cmSourceFile *this,string *prop)

{
  __type _Var1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  cmMakefile *this_00;
  cmState *this_01;
  bool chain;
  cmMakefile *mf;
  cmValue retVal;
  string local_a0;
  string_view local_80;
  string local_70;
  string_view local_50;
  string local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  string *prop_local;
  cmSourceFile *this_local;
  
  local_20 = prop;
  prop_local = (string *)this;
  _Var1 = std::operator==(prop,&propLOCATION_abi_cxx11_);
  if (_Var1) {
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      cmValue::cmValue((cmValue *)&this_local,&this->FullPath);
    }
    else {
      cmValue::cmValue((cmValue *)&this_local,(nullptr_t)0x0);
    }
  }
  else {
    _Var1 = std::operator==(local_20,&propINCLUDE_DIRECTORIES_abi_cxx11_);
    if (_Var1) {
      bVar2 = std::
              vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::empty(&this->IncludeDirectories);
      if (bVar2) {
        cmValue::cmValue((cmValue *)&this_local,(nullptr_t)0x0);
      }
      else {
        if (GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') {
          iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
          if (iVar3 != 0) {
            std::__cxx11::string::string
                      ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
            __cxa_atexit(std::__cxx11::string::~string,
                         &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,&__dso_handle)
            ;
            __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
          }
        }
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_50,";");
        cmJoin<std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>
                  (&local_40,&this->IncludeDirectories,local_50);
        std::__cxx11::string::operator=
                  ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                   (string *)&local_40);
        std::__cxx11::string::~string((string *)&local_40);
        cmValue::cmValue((cmValue *)&this_local,
                         &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
      }
    }
    else {
      _Var1 = std::operator==(local_20,&propCOMPILE_OPTIONS_abi_cxx11_);
      if (_Var1) {
        bVar2 = std::
                vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::empty(&this->CompileOptions);
        if (bVar2) {
          cmValue::cmValue((cmValue *)&this_local,(nullptr_t)0x0);
        }
        else {
          if (GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') {
            iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_
                                       );
            if (iVar3 != 0) {
              std::__cxx11::string::string
                        ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
              __cxa_atexit(std::__cxx11::string::~string,
                           &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                           &__dso_handle);
              __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
            }
          }
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_80,";");
          cmJoin<std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>
                    (&local_70,&this->CompileOptions,local_80);
          std::__cxx11::string::operator=
                    ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                     (string *)&local_70);
          std::__cxx11::string::~string((string *)&local_70);
          cmValue::cmValue((cmValue *)&this_local,
                           &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
        }
      }
      else {
        _Var1 = std::operator==(local_20,&propCOMPILE_DEFINITIONS_abi_cxx11_);
        if (_Var1) {
          bVar2 = std::
                  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::empty(&this->CompileDefinitions);
          if (bVar2) {
            cmValue::cmValue((cmValue *)&this_local,(nullptr_t)0x0);
          }
          else {
            if (GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') {
              iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                           output_abi_cxx11_);
              if (iVar3 != 0) {
                std::__cxx11::string::string
                          ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
                __cxa_atexit(std::__cxx11::string::~string,
                             &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                             &__dso_handle);
                __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
              }
            }
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)&retVal,";");
            cmJoin<std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>
                      (&local_a0,&this->CompileDefinitions,_retVal);
            std::__cxx11::string::operator=
                      ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                       (string *)&local_a0);
            std::__cxx11::string::~string((string *)&local_a0);
            cmValue::cmValue((cmValue *)&this_local,
                             &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_);
          }
        }
        else {
          mf = (cmMakefile *)cmPropertyMap::GetPropertyValue(&this->Properties,local_20);
          bVar2 = cmValue::operator_cast_to_bool((cmValue *)&mf);
          if (bVar2) {
            this_local = (cmSourceFile *)mf;
          }
          else {
            this_00 = cmSourceFileLocation::GetMakefile(&this->Location);
            this_01 = cmMakefile::GetState(this_00);
            bVar2 = cmState::IsPropertyChained(this_01,local_20,SOURCE_FILE);
            if (bVar2) {
              this_local = (cmSourceFile *)cmMakefile::GetProperty(this_00,local_20,bVar2);
            }
            else {
              cmValue::cmValue((cmValue *)&this_local,(nullptr_t)0x0);
            }
          }
        }
      }
    }
  }
  return (cmValue)(string *)this_local;
}

Assistant:

cmValue cmSourceFile::GetProperty(const std::string& prop) const
{
  // Check for computed properties.
  if (prop == propLOCATION) {
    if (this->FullPath.empty()) {
      return nullptr;
    }
    return cmValue(this->FullPath);
  }

  // Check for the properties with backtraces.
  if (prop == propINCLUDE_DIRECTORIES) {
    if (this->IncludeDirectories.empty()) {
      return nullptr;
    }

    static std::string output;
    output = cmJoin(this->IncludeDirectories, ";");
    return cmValue(output);
  }

  if (prop == propCOMPILE_OPTIONS) {
    if (this->CompileOptions.empty()) {
      return nullptr;
    }

    static std::string output;
    output = cmJoin(this->CompileOptions, ";");
    return cmValue(output);
  }

  if (prop == propCOMPILE_DEFINITIONS) {
    if (this->CompileDefinitions.empty()) {
      return nullptr;
    }

    static std::string output;
    output = cmJoin(this->CompileDefinitions, ";");
    return cmValue(output);
  }

  cmValue retVal = this->Properties.GetPropertyValue(prop);
  if (!retVal) {
    cmMakefile const* mf = this->Location.GetMakefile();
    const bool chain =
      mf->GetState()->IsPropertyChained(prop, cmProperty::SOURCE_FILE);
    if (chain) {
      return mf->GetProperty(prop, chain);
    }
    return nullptr;
  }

  return retVal;
}